

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::HttpOutputStream::finishBody(HttpOutputStream *this)

{
  bool bVar1;
  char (*in_RCX) [65];
  String local_1e0;
  Exception local_1c8;
  Promise<void> local_38 [3];
  Fault local_20;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  HttpOutputStream *this_local;
  
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->inBody);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
  if (bVar1) {
    this->inBody = false;
    if ((this->writeInProgress & 1U) != 0) {
      this->broken = true;
      kj::_::Debug::makeDescription<char_const(&)[65]>
                (&local_1e0,(Debug *)0x95b90b,
                 "previous HTTP message body incomplete; can\'t write more messages",in_RCX);
      Exception::Exception
                (&local_1c8,FAILED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x924,&local_1e0);
      Promise<void>::Promise(local_38,&local_1c8);
      Promise<void>::operator=(&this->writeQueue,local_38);
      Promise<void>::~Promise(local_38);
      Exception::~Exception(&local_1c8);
      String::~String(&local_1e0);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x91a,FAILED,"inBody","_kjCondition,",(DebugExpression<bool_&> *)&f);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return;
}

Assistant:

void finishBody() {
    // Called when entire body was written.

    KJ_REQUIRE(inBody) { return; }
    inBody = false;

    if (writeInProgress) {
      // It looks like the last write never completed -- possibly because it was canceled or threw
      // an exception. We must treat this equivalent to abortBody().
      broken = true;

      // Cancel any writes that are still queued.
      writeQueue = KJ_EXCEPTION(FAILED,
          "previous HTTP message body incomplete; can't write more messages");
    }
  }